

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

Label __thiscall
asmjit::CodeBuilder::newNamedLabel
          (CodeBuilder *this,char *name,size_t nameLength,uint32_t type,uint32_t parentId)

{
  Error error;
  Error extraout_EAX;
  undefined8 *puVar1;
  undefined4 in_register_0000000c;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  uint32_t in_R9D;
  Label LVar2;
  uint32_t id;
  uint32_t local_40;
  uint32_t local_3c;
  size_t local_38;
  
  local_40 = 0xffffffff;
  if (*(int *)(name + 0x2c) == 0) {
    if (*(long *)(name + 0xe0) == 0) {
      newNamedLabel();
      error = extraout_EAX;
    }
    else {
      local_3c = in_R9D;
      puVar1 = (undefined8 *)ZoneHeap::_alloc((ZoneHeap *)(name + 0xe0),0x38,&local_38);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined2 *)(puVar1 + 2) = 4;
      *(undefined2 *)((long)puVar1 + 0x12) = *(undefined2 *)(name + 0x18c);
      *(undefined4 *)((long)puVar1 + 0x14) = *(undefined4 *)(name + 0x188);
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0xffffffff;
      puVar1[6] = 0;
      error = CodeHolder::newNamedLabelId
                        (*(CodeHolder **)(name + 0x18),&local_40,(char *)nameLength,
                         CONCAT44(in_register_0000000c,type),parentId,local_3c);
      if (error == 0) {
        local_40 = *(uint32_t *)(puVar1 + 5);
        nameLength = extraout_RDX;
        goto LAB_001125db;
      }
    }
    CodeEmitter::setLastError((CodeEmitter *)name,error,(char *)0x0);
    nameLength = extraout_RDX_00;
  }
LAB_001125db:
  (this->super_CodeEmitter)._vptr_CodeEmitter = (_func_int **)((ulong)local_40 << 0x20 | 4);
  (this->super_CodeEmitter)._codeInfo._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (this->super_CodeEmitter)._codeInfo.field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  LVar2.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)nameLength;
  LVar2.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)this;
  return (Label)LVar2.super_Operand.super_Operand_.field_0;
}

Assistant:

Label CodeBuilder::newNamedLabel(const char* name, size_t nameLength, uint32_t type, uint32_t parentId) {
  uint32_t id = kInvalidValue;

  if (!_lastError) {
    CBLabel* node = newNodeT<CBLabel>(id);
    if (ASMJIT_UNLIKELY(!node)) {
      setLastError(DebugUtils::errored(kErrorNoHeapMemory));
    }
    else {
      Error err = _code->newNamedLabelId(id, name, nameLength, type, parentId);
      if (ASMJIT_UNLIKELY(err))
        setLastError(err);
      else
        id = node->getId();
    }
  }

  return Label(id);
}